

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O3

AttVal * ParseAttrs(TidyDocImpl *doc,Bool *isempty)

{
  int iVar1;
  Node *pNVar2;
  Bool BVar3;
  uint uVar4;
  int iVar5;
  tmbstr name;
  tmbstr ptVar6;
  AttVal *pAVar7;
  AttVal *pAVar8;
  Attribute *pAVar9;
  AttVal *pAVar10;
  AttVal *pAVar11;
  Node *pNVar12;
  StreamIn *in;
  ulong uVar13;
  AttVal *list;
  int delim;
  Node *php;
  Node *asp;
  AttVal *local_60;
  Lexer *local_58;
  int local_4c;
  Node *local_48;
  Node *local_40;
  Node *local_38;
  
  local_58 = doc->lexer;
  local_60 = (AttVal *)0x0;
  in = doc->docIn;
  if (in != (StreamIn *)0x0) {
    local_48 = (Node *)isempty;
    do {
      if ((in->pushed == no) && (BVar3 = prvTidyIsEOF(in), BVar3 != no)) {
        return local_60;
      }
      name = ParseAttribute(doc,isempty,&local_38,&local_40);
      pNVar2 = local_38;
      pNVar12 = local_40;
      if (name == (tmbstr)0x0) {
        if (local_38 == (Node *)0x0) {
          if (local_40 == (Node *)0x0) {
            return local_60;
          }
          pAVar8 = (AttVal *)(*doc->allocator->vtbl->alloc)(doc->allocator,0x38);
          pAVar8->asp = (Node *)0x0;
          pAVar8->php = (Node *)0x0;
          pAVar8->next = (AttVal *)0x0;
          pAVar8->dict = (Attribute *)0x0;
          *(undefined8 *)&pAVar8->delim = 0;
          pAVar8->attribute = (tmbstr)0x0;
          pAVar8->value = (tmbstr)0x0;
          pAVar8->php = pNVar12;
          pAVar7 = local_60;
          pAVar10 = (AttVal *)&local_60;
          while (pAVar11 = pAVar7, pAVar11 != (AttVal *)0x0) {
            pAVar10 = pAVar11;
            pAVar7 = pAVar11->next;
          }
        }
        else {
          pAVar8 = (AttVal *)(*doc->allocator->vtbl->alloc)(doc->allocator,0x38);
          pAVar8->asp = (Node *)0x0;
          pAVar8->php = (Node *)0x0;
          pAVar8->next = (AttVal *)0x0;
          pAVar8->dict = (Attribute *)0x0;
          *(undefined8 *)&pAVar8->delim = 0;
          pAVar8->attribute = (tmbstr)0x0;
          pAVar8->value = (tmbstr)0x0;
          pAVar8->asp = pNVar2;
          pAVar7 = local_60;
          pAVar10 = (AttVal *)&local_60;
          while (pAVar11 = pAVar7, pAVar11 != (AttVal *)0x0) {
            pAVar10 = pAVar11;
            pAVar7 = pAVar11->next;
          }
        }
        pAVar10->next = pAVar8;
      }
      else {
        ptVar6 = ParseValue(doc,name,no,isempty,&local_4c);
        if (((long)*name < 0) || ((lexmap[*name] & 2) == 0)) {
LAB_00146e5e:
          if ((*(int *)((doc->config).value + 0x67) == 0) ||
             (BVar3 = prvTidyIsValidXMLID(name), BVar3 == no)) {
            pAVar7 = (AttVal *)(*doc->allocator->vtbl->alloc)(doc->allocator,0x38);
            pAVar7->next = (AttVal *)0x0;
            pAVar7->dict = (Attribute *)0x0;
            pAVar7->asp = (Node *)0x0;
            pAVar7->php = (Node *)0x0;
            *(undefined8 *)&pAVar7->delim = 0;
            pAVar7->attribute = name;
            pAVar7->value = ptVar6;
            if ((*name == '\0') ||
               (uVar4 = prvTidytmbstrlen(name), name[(long)(int)uVar4 + -1] != '\"')) {
              pNVar12 = local_58->token;
              if (ptVar6 == (tmbstr)0x0) {
                uVar4 = 0x256;
              }
              else {
                uVar4 = 0x248;
              }
            }
            else {
              pNVar12 = local_58->token;
              uVar4 = 0x25d;
            }
            prvTidyReportAttrError(doc,pNVar12,pAVar7,uVar4);
            prvTidyFreeAttribute(doc,pAVar7);
            goto LAB_001470a7;
          }
        }
        else {
          uVar4 = prvTidytmbstrlen(name);
          if (1 < uVar4) {
            uVar13 = 1;
            do {
              if (((long)name[uVar13] < 0) || ((lexmap[name[uVar13]] & 4) == 0)) goto LAB_00146e5e;
              uVar13 = uVar13 + 1;
              uVar4 = prvTidytmbstrlen(name);
            } while (uVar13 < uVar4);
          }
        }
        pAVar7 = (AttVal *)(*doc->allocator->vtbl->alloc)(doc->allocator,0x38);
        iVar1 = local_4c;
        pAVar7->next = (AttVal *)0x0;
        pAVar7->dict = (Attribute *)0x0;
        pAVar7->asp = (Node *)0x0;
        pAVar7->php = (Node *)0x0;
        *(undefined8 *)&pAVar7->delim = 0;
        iVar5 = local_4c;
        if (local_4c == 0) {
          iVar5 = 0x22;
        }
        pAVar7->delim = iVar5;
        pAVar7->attribute = name;
        pAVar7->value = ptVar6;
        pAVar9 = prvTidyFindAttribute(doc,pAVar7);
        pAVar7->dict = pAVar9;
        pAVar10 = (AttVal *)&local_60;
        for (pAVar8 = local_60; pAVar8 != (AttVal *)0x0; pAVar8 = pAVar8->next) {
          pAVar10 = pAVar8;
        }
        pAVar10->next = pAVar7;
        isempty = (Bool *)local_48;
        if (ptVar6 != (tmbstr)0x0 && iVar1 == 0) {
          prvTidyReportAttrError(doc,local_58->token,pAVar7,0x25e);
        }
      }
LAB_001470a7:
      in = doc->docIn;
    } while (in != (StreamIn *)0x0);
  }
  __assert_fail("doc->docIn != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/htacg[P]tidy-html5/src/lexer.c",
                0x386,"Bool EndOfInput(TidyDocImpl *)");
}

Assistant:

static AttVal* ParseAttrs( TidyDocImpl* doc, Bool *isempty )
{
    Lexer* lexer = doc->lexer;
    AttVal *av, *list;
    tmbstr value;
    int delim;
    Node *asp, *php;

    list = NULL;

    while ( !EndOfInput(doc) )
    {
        tmbstr attribute = ParseAttribute( doc, isempty, &asp, &php );

        if (attribute == NULL)
        {
            /* check if attributes are created by ASP markup */
            if (asp)
            {
                av = TY_(NewAttribute)(doc);
                av->asp = asp;
                AddAttrToList( &list, av ); 
                continue;
            }

            /* check if attributes are created by PHP markup */
            if (php)
            {
                av = TY_(NewAttribute)(doc);
                av->php = php;
                AddAttrToList( &list, av ); 
                continue;
            }

            break;
        }

        value = ParseValue( doc, attribute, no, isempty, &delim );

        if (attribute && (IsValidAttrName(attribute) ||
            (cfgBool(doc, TidyXmlTags) && IsValidXMLAttrName(attribute))))
        {
            av = TY_(NewAttribute)(doc);
            av->delim = delim ? delim : '"';
            av->attribute = attribute;
            av->value = value;
            av->dict = TY_(FindAttribute)( doc, av );
            AddAttrToList( &list, av );
            if ( !delim && value )
                TY_(ReportAttrError)( doc, lexer->token, av, MISSING_QUOTEMARK_OPEN);
        }
        else
        {
            av = TY_(NewAttribute)(doc);
            av->attribute = attribute;
            av->value = value;

            if (LastChar(attribute) == '"')
                TY_(ReportAttrError)( doc, lexer->token, av, MISSING_QUOTEMARK);
            else if (value == NULL)
                TY_(ReportAttrError)(doc, lexer->token, av, MISSING_ATTR_VALUE);
            else
                TY_(ReportAttrError)(doc, lexer->token, av, INVALID_ATTRIBUTE);

            TY_(FreeAttribute)( doc, av );
        }
    }

    return list;
}